

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RVOSimulator.cpp
# Opt level: O3

size_t __thiscall RVO::RVOSimulator::addAgent(RVOSimulator *this,Vector2 *position)

{
  Agent *pAVar1;
  iterator __position;
  float fVar2;
  Agent *this_00;
  pointer ppAVar3;
  size_t sVar4;
  Agent *agent;
  Agent *local_20;
  
  if (this->defaultAgent_ == (Agent *)0x0) {
    sVar4 = 0xffffffffffffffff;
  }
  else {
    this_00 = (Agent *)operator_new(0x98);
    Agent::Agent(this_00,this);
    this_00->position_ = *position;
    pAVar1 = this->defaultAgent_;
    this_00->maxNeighbors_ = pAVar1->maxNeighbors_;
    fVar2 = pAVar1->neighborDist_;
    this_00->maxSpeed_ = pAVar1->maxSpeed_;
    this_00->neighborDist_ = fVar2;
    this_00->radius_ = pAVar1->radius_;
    fVar2 = pAVar1->timeHorizonObst_;
    this_00->timeHorizon_ = pAVar1->timeHorizon_;
    this_00->timeHorizonObst_ = fVar2;
    this_00->velocity_ = pAVar1->velocity_;
    __position._M_current =
         (this->agents_).super__Vector_base<RVO::Agent_*,_std::allocator<RVO::Agent_*>_>._M_impl.
         super__Vector_impl_data._M_finish;
    this_00->id_ = (long)__position._M_current -
                   (long)(this->agents_).
                         super__Vector_base<RVO::Agent_*,_std::allocator<RVO::Agent_*>_>._M_impl.
                         super__Vector_impl_data._M_start >> 3;
    if (__position._M_current ==
        (this->agents_).super__Vector_base<RVO::Agent_*,_std::allocator<RVO::Agent_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      local_20 = this_00;
      std::vector<RVO::Agent*,std::allocator<RVO::Agent*>>::_M_realloc_insert<RVO::Agent*const&>
                ((vector<RVO::Agent*,std::allocator<RVO::Agent*>> *)this,__position,&local_20);
      ppAVar3 = (this->agents_).super__Vector_base<RVO::Agent_*,_std::allocator<RVO::Agent_*>_>.
                _M_impl.super__Vector_impl_data._M_finish;
    }
    else {
      *__position._M_current = this_00;
      ppAVar3 = (this->agents_).super__Vector_base<RVO::Agent_*,_std::allocator<RVO::Agent_*>_>.
                _M_impl.super__Vector_impl_data._M_finish + 1;
      (this->agents_).super__Vector_base<RVO::Agent_*,_std::allocator<RVO::Agent_*>_>._M_impl.
      super__Vector_impl_data._M_finish = ppAVar3;
    }
    sVar4 = ((long)ppAVar3 -
             (long)(this->agents_).super__Vector_base<RVO::Agent_*,_std::allocator<RVO::Agent_*>_>.
                   _M_impl.super__Vector_impl_data._M_start >> 3) - 1;
  }
  return sVar4;
}

Assistant:

size_t RVOSimulator::addAgent(const Vector2 &position)
	{
		if (defaultAgent_ == NULL) {
			return RVO_ERROR;
		}

		Agent *agent = new Agent(this);

		agent->position_ = position;
		agent->maxNeighbors_ = defaultAgent_->maxNeighbors_;
		agent->maxSpeed_ = defaultAgent_->maxSpeed_;
		agent->neighborDist_ = defaultAgent_->neighborDist_;
		agent->radius_ = defaultAgent_->radius_;
		agent->timeHorizon_ = defaultAgent_->timeHorizon_;
		agent->timeHorizonObst_ = defaultAgent_->timeHorizonObst_;
		agent->velocity_ = defaultAgent_->velocity_;

		agent->id_ = agents_.size();

		agents_.push_back(agent);

		return agents_.size() - 1;
	}